

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNode * __thiscall Parser::compareExpr(Parser *this)

{
  bool bVar1;
  InfixExprNode *pIVar2;
  InfixExprNode *this_00;
  ExprNode **ppEVar3;
  ExprNode *pEVar4;
  Token op;
  Token tok;
  Token local_1f0;
  Token local_180;
  Token local_110;
  Token local_a0;
  
  pIVar2 = (InfixExprNode *)arithExpr(this);
  Tokenizer::getToken(&local_180,this->tokenizer);
  while( true ) {
    bVar1 = Token::isComparisonOperator(&local_180);
    if (!bVar1) break;
    Tokenizer::ungetToken(this->tokenizer);
    compareOp(&local_1f0,this);
    this_00 = (InfixExprNode *)operator_new(0x90);
    Token::Token(&local_110,&local_1f0);
    InfixExprNode::InfixExprNode(this_00,&local_110);
    Token::~Token(&local_110);
    ppEVar3 = InfixExprNode::left(this_00);
    *ppEVar3 = &pIVar2->super_ExprNode;
    pEVar4 = arithExpr(this);
    ppEVar3 = InfixExprNode::right(this_00);
    *ppEVar3 = pEVar4;
    Tokenizer::getToken(&local_a0,this->tokenizer);
    Token::operator=(&local_180,&local_a0);
    Token::~Token(&local_a0);
    Token::~Token(&local_1f0);
    pIVar2 = this_00;
  }
  Tokenizer::ungetToken(this->tokenizer);
  Token::~Token(&local_180);
  return &pIVar2->super_ExprNode;
}

Assistant:

ExprNode *Parser::compareExpr() {

    // comparison: arith_expr {comp_op arith_expr}*

    ExprNode *left = arithExpr();
    Token tok = tokenizer.getToken();
    while (tok.isComparisonOperator()) {
        tokenizer.ungetToken();
        Token op = compareOp();
        auto *p = new InfixExprNode(op);
        p->left() = left;
        p->right() = arithExpr();
        left = p;
        tok = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return left;
}